

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.h
# Opt level: O0

bool __thiscall lzham::lzcompressor::state_base::operator==(state_base *this,state_base *rhs)

{
  uint i;
  state_base *rhs_local;
  state_base *this_local;
  bool local_1;
  
  if (this->m_cur_state == rhs->m_cur_state) {
    for (i = 0; i < 4; i = i + 1) {
      if (this->m_match_hist[i] != rhs->m_match_hist[i]) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool operator== (const state_base &rhs) const
         {
            if (m_cur_state != rhs.m_cur_state)
               return false;
            for (uint i = 0; i < CLZBase::cMatchHistSize; i++)
               if (m_match_hist[i] != rhs.m_match_hist[i])
                  return false;
            return true;
         }